

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void setnodevector(lua_State *L,Table *t,int size)

{
  int iVar1;
  Node *pNVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  if (size == 0) {
    pNVar2 = &dummynode_;
    t->node = &dummynode_;
    bVar4 = 0;
    lVar6 = 0;
  }
  else {
    iVar1 = luaO_log2(size - 1);
    if (0x1d < iVar1) {
      luaG_runerror(L,"table overflow");
    }
    bVar4 = (char)iVar1 + 1;
    lVar6 = 0x100000000 << (bVar4 & 0x3f);
    if (lVar6 + 0x100000000 < 0) {
      luaM_toobig(L);
    }
    uVar5 = 1L << (bVar4 & 0x3f);
    lVar6 = lVar6 >> 0x20;
    lVar7 = 0;
    pNVar2 = (Node *)luaM_realloc_(L,(void *)0x0,0,lVar6 * 0x28);
    t->node = pNVar2;
    uVar3 = 0;
    if (0 < (int)uVar5) {
      uVar3 = uVar5 & 0xffffffff;
    }
    for (; uVar3 * 0x28 - lVar7 != 0; lVar7 = lVar7 + 0x28) {
      pNVar2 = t->node;
      *(undefined8 *)((long)&pNVar2->i_key + lVar7 + 0x10) = 0;
      *(undefined4 *)((long)&pNVar2->i_key + lVar7 + 8) = 0;
      *(undefined4 *)((long)&(pNVar2->i_val).tt + lVar7) = 0;
    }
    pNVar2 = t->node;
  }
  t->lsizenode = bVar4;
  t->lastfree = pNVar2 + lVar6;
  return;
}

Assistant:

static void setnodevector(lua_State*L,Table*t,int size){
int lsize;
if(size==0){
t->node=cast(Node*,(&dummynode_));
lsize=0;
}
else{
int i;
lsize=ceillog2(size);
if(lsize>(32-2))
luaG_runerror(L,"table overflow");
size=twoto(lsize);
t->node=luaM_newvector(L,size,Node);
for(i=0;i<size;i++){
Node*n=gnode(t,i);
gnext(n)=NULL;
setnilvalue(gkey(n));
setnilvalue(gval(n));
}
}
t->lsizenode=cast_byte(lsize);
t->lastfree=gnode(t,size);
}